

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_ecb(ptls_cipher_algorithm_t *algo,void *expected,size_t expected_len)

{
  int iVar1;
  void *__s;
  ptls_cipher_context_t *ppVar2;
  ptls_cipher_context_t *ctx;
  uint8_t *actual;
  size_t expected_len_local;
  void *expected_local;
  ptls_cipher_algorithm_t *algo_local;
  
  __s = malloc(expected_len);
  if (__s != (void *)0x0) {
    memset(__s,0,expected_len);
    ppVar2 = ptls_cipher_new(algo,1,"");
    ptls_cipher_encrypt(ppVar2,__s,"",expected_len);
    ptls_cipher_free(ppVar2);
    iVar1 = memcmp(__s,expected,expected_len);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xd1);
    ppVar2 = ptls_cipher_new(algo,0,"");
    ptls_cipher_encrypt(ppVar2,__s,__s,expected_len);
    ptls_cipher_free(ppVar2);
    iVar1 = memcmp(__s,"",expected_len);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xd7);
    free(__s);
    return;
  }
  __assert_fail("actual != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0xcb,"void test_ecb(ptls_cipher_algorithm_t *, const void *, size_t)");
}

Assistant:

static void test_ecb(ptls_cipher_algorithm_t *algo, const void *expected, size_t expected_len)
{
    static const uint8_t key[] = {0,  1,  2,  3,  4,  5,  6,  7,  8,  9,  10, 11, 12, 13, 14, 15,
                                  16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31},
                         plaintext[] = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77,
                                        0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    uint8_t *actual = malloc(expected_len);
    assert(actual != NULL);
    /* encrypt */
    memset(actual, 0, expected_len);
    ptls_cipher_context_t *ctx = ptls_cipher_new(algo, 1, key);
    ptls_cipher_encrypt(ctx, actual, plaintext, expected_len);
    ptls_cipher_free(ctx);
    ok(memcmp(actual, expected, expected_len) == 0);

    /* decrypt */
    ctx = ptls_cipher_new(algo, 0, key);
    ptls_cipher_encrypt(ctx, actual, actual, expected_len);
    ptls_cipher_free(ctx);
    ok(memcmp(actual, plaintext, expected_len) == 0);

    free(actual);
}